

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cc
# Opt level: O0

uchar * SHA1(uchar *d,size_t n,uchar *md)

{
  undefined1 local_80 [8];
  SHA_CTX ctx;
  uint8_t *out_local;
  size_t len_local;
  uint8_t *data_local;
  
  ctx._88_8_ = md;
  BCM_sha1_init((SHA_CTX *)local_80);
  BCM_sha1_update((SHA_CTX *)local_80,d,n);
  BCM_sha1_final((uint8_t *)ctx._88_8_,(SHA_CTX *)local_80);
  OPENSSL_cleanse(local_80,0x60);
  return (uchar *)ctx._88_8_;
}

Assistant:

uint8_t *SHA1(const uint8_t *data, size_t len, uint8_t out[SHA_DIGEST_LENGTH]) {
  SHA_CTX ctx;
  BCM_sha1_init(&ctx);
  BCM_sha1_update(&ctx, data, len);
  BCM_sha1_final(out, &ctx);
  OPENSSL_cleanse(&ctx, sizeof(ctx));
  return out;
}